

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves_sort.cpp
# Opt level: O3

bool NextMove(Situation *situation,MoveGenerate *generate,Movement *hash_move,int step)

{
  MoveGenerate *__last;
  Movement *__last_00;
  Movement *pMVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined2 uVar11;
  undefined2 uVar12;
  Movement (*paMVar13) [2];
  Movement *pMVar14;
  UINT8 UVar15;
  UINT8 UVar16;
  UINT8 UVar17;
  undefined1 uVar18;
  UINT32 UVar19;
  UINT8 UVar20;
  UINT8 UVar21;
  undefined2 uVar22;
  undefined1 uVar23;
  UINT8 UVar24;
  undefined2 uVar25;
  UINT8 UVar26;
  bool bVar27;
  int iVar28;
  Movement *__i;
  MoveGenerate *pMVar29;
  MoveGenerate *pMVar30;
  undefined8 uVar31;
  Movement *pMVar32;
  ulong uVar33;
  long lVar34;
  MoveGenerate *pMVar35;
  Movement *pMVar36;
  long lVar37;
  size_t sVar38;
  long lVar39;
  Movement *pMVar40;
  Movement *__i_1;
  
  switch(generate->state) {
  case 1:
    generate->state = 2;
    if ((hash_move->from == '\0') || (bVar27 = MovementsLegal(*hash_move,situation), !bVar27))
    goto switchD_00106645_caseD_2;
    goto LAB_0010693d;
  case 2:
switchD_00106645_caseD_2:
    GetAllCaptureMovements(situation,&generate->move_nums,generate->moves);
    CaptureValue(situation,&generate->move_nums,generate->moves);
    iVar28 = generate->move_nums;
    uVar33 = (ulong)iVar28;
    if (uVar33 != 0) {
      __last = (MoveGenerate *)(generate->moves + uVar33);
      lVar37 = 0x3f;
      if (uVar33 != 0) {
        for (; uVar33 >> lVar37 == 0; lVar37 = lVar37 + -1) {
        }
      }
      std::
      __introsort_loop<Movement*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Movement&,Movement&)>>
                (generate->moves,(Movement *)__last,(ulong)(((uint)lVar37 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(Movement_&,_Movement_&)>)0x105fe2);
      if (iVar28 < 0x11) {
        if (iVar28 != 1) {
          pMVar29 = (MoveGenerate *)(generate->moves + 1);
          pMVar35 = generate;
          do {
            pMVar30 = pMVar29;
            uVar4 = pMVar30->moves[0].value;
            if (generate->moves[0].value < uVar4) {
              UVar20 = pMVar30->moves[0].catc;
              UVar21 = pMVar30->moves[0].movec;
              uVar22 = *(undefined2 *)&pMVar30->moves[0].field_0xa;
              UVar15 = pMVar30->moves[0].from;
              UVar16 = pMVar30->moves[0].to;
              UVar17 = pMVar30->moves[0].capture;
              uVar18 = pMVar30->moves[0].field_0x3;
              UVar19 = pMVar30->moves[0].value;
              memmove((void *)((long)pMVar35 + (0x18 - ((long)pMVar30 - (long)generate))),generate,
                      (long)pMVar30 - (long)generate);
              generate->moves[0].from = UVar15;
              generate->moves[0].to = UVar16;
              generate->moves[0].capture = UVar17;
              generate->moves[0].field_0x3 = uVar18;
              generate->moves[0].value = UVar19;
              generate->moves[0].catc = UVar20;
              generate->moves[0].movec = UVar21;
              *(undefined2 *)&generate->moves[0].field_0xa = uVar22;
            }
            else {
              UVar15 = pMVar35->moves[1].from;
              UVar16 = pMVar35->moves[1].to;
              UVar17 = pMVar35->moves[1].capture;
              uVar18 = pMVar35->moves[1].field_0x3;
              UVar20 = pMVar30->moves[0].catc;
              UVar21 = pMVar30->moves[0].movec;
              uVar22 = *(undefined2 *)&pMVar30->moves[0].field_0xa;
              uVar2 = pMVar35->moves[0].value;
              pMVar29 = pMVar30;
              while (uVar2 < uVar4) {
                UVar24 = pMVar29[-1].next.movec;
                uVar25 = *(undefined2 *)&pMVar29[-1].next.field_0xa;
                pMVar29->moves[0].catc = pMVar29[-1].next.catc;
                pMVar29->moves[0].movec = UVar24;
                *(undefined2 *)&pMVar29->moves[0].field_0xa = uVar25;
                UVar24 = pMVar29[-1].next.to;
                UVar26 = pMVar29[-1].next.capture;
                uVar23 = pMVar29[-1].next.field_0x3;
                UVar19 = pMVar29[-1].next.value;
                pMVar29->moves[0].from = pMVar29[-1].next.from;
                pMVar29->moves[0].to = UVar24;
                pMVar29->moves[0].capture = UVar26;
                pMVar29->moves[0].field_0x3 = uVar23;
                pMVar29->moves[0].value = UVar19;
                uVar2 = pMVar29[-1].move_nums;
                pMVar29 = (MoveGenerate *)&pMVar29[-1].next;
              }
              pMVar29->moves[0].from = UVar15;
              pMVar29->moves[0].to = UVar16;
              pMVar29->moves[0].capture = UVar17;
              pMVar29->moves[0].field_0x3 = uVar18;
              pMVar29->moves[0].value = uVar4;
              pMVar29->moves[0].catc = UVar20;
              pMVar29->moves[0].movec = UVar21;
              *(undefined2 *)&pMVar29->moves[0].field_0xa = uVar22;
            }
            pMVar29 = (MoveGenerate *)(pMVar30->moves + 1);
            pMVar35 = pMVar30;
          } while ((MoveGenerate *)(pMVar30->moves + 1) != __last);
        }
      }
      else {
        pMVar32 = generate->moves;
        sVar38 = 0xc;
        pMVar29 = generate;
        do {
          pMVar35 = (MoveGenerate *)(&generate->moves[0].from + sVar38);
          uVar4 = *(uint *)((long)&generate->moves[0].value + sVar38);
          if (generate->moves[0].value < uVar4) {
            UVar20 = pMVar35->moves[0].catc;
            UVar21 = pMVar35->moves[0].movec;
            uVar22 = *(undefined2 *)&pMVar35->moves[0].field_0xa;
            UVar15 = pMVar35->moves[0].from;
            UVar16 = pMVar35->moves[0].to;
            UVar17 = pMVar35->moves[0].capture;
            uVar18 = pMVar35->moves[0].field_0x3;
            UVar19 = pMVar35->moves[0].value;
            memmove((void *)((long)pMVar29 + (0x18 - sVar38)),generate,sVar38);
            generate->moves[0].from = UVar15;
            generate->moves[0].to = UVar16;
            generate->moves[0].capture = UVar17;
            generate->moves[0].field_0x3 = uVar18;
            generate->moves[0].value = UVar19;
            generate->moves[0].catc = UVar20;
            generate->moves[0].movec = UVar21;
            *(undefined2 *)&generate->moves[0].field_0xa = uVar22;
          }
          else {
            UVar15 = pMVar35->moves[0].from;
            UVar16 = pMVar35->moves[0].to;
            UVar17 = pMVar35->moves[0].capture;
            uVar18 = pMVar35->moves[0].field_0x3;
            UVar20 = pMVar35->moves[0].catc;
            UVar21 = pMVar35->moves[0].movec;
            uVar22 = *(undefined2 *)&pMVar35->moves[0].field_0xa;
            uVar2 = pMVar29->moves[0].value;
            pMVar29 = pMVar35;
            pMVar30 = (MoveGenerate *)(pMVar32 + 1);
            while (uVar2 < uVar4) {
              pMVar29 = (MoveGenerate *)((long)(pMVar30 + 0xffffffffffffffff) + 0x60c);
              *(undefined4 *)((long)pMVar30->moves + 8) =
                   *(undefined4 *)((long)(pMVar30 + 0xffffffffffffffff) + 0x614);
              *(undefined8 *)pMVar30->moves =
                   *(undefined8 *)((long)(pMVar30 + 0xffffffffffffffff) + 0x60c);
              uVar2 = *(int *)((long)(pMVar30 + 0xffffffffffffffff) + 0x604);
              pMVar30 = pMVar29;
            }
            pMVar29->moves[0].from = UVar15;
            pMVar29->moves[0].to = UVar16;
            pMVar29->moves[0].capture = UVar17;
            pMVar29->moves[0].field_0x3 = uVar18;
            pMVar29->moves[0].value = uVar4;
            pMVar29->moves[0].catc = UVar20;
            pMVar29->moves[0].movec = UVar21;
            *(undefined2 *)&pMVar29->moves[0].field_0xa = uVar22;
          }
          sVar38 = sVar38 + 0xc;
          pMVar32 = ((MoveGenerate *)(pMVar32 + 1))->moves;
          pMVar29 = pMVar35;
        } while (sVar38 != 0xc0);
        pMVar29 = (MoveGenerate *)(generate->moves + 0x10);
        do {
          UVar15 = pMVar29->moves[0].from;
          UVar16 = pMVar29->moves[0].to;
          UVar17 = pMVar29->moves[0].capture;
          uVar18 = pMVar29->moves[0].field_0x3;
          uVar5 = pMVar29->moves[0].value;
          uVar7 = pMVar29->moves[0].catc;
          uVar9 = pMVar29->moves[0].movec;
          uVar11 = *(undefined2 *)&pMVar29->moves[0].field_0xa;
          uVar4 = pMVar29[-1].next.value;
          pMVar35 = pMVar29;
          while (uVar4 < (uint)uVar5) {
            UVar20 = pMVar35[-1].next.movec;
            uVar22 = *(undefined2 *)&pMVar35[-1].next.field_0xa;
            pMVar35->moves[0].catc = pMVar35[-1].next.catc;
            pMVar35->moves[0].movec = UVar20;
            *(undefined2 *)&pMVar35->moves[0].field_0xa = uVar22;
            UVar20 = pMVar35[-1].next.to;
            UVar21 = pMVar35[-1].next.capture;
            uVar23 = pMVar35[-1].next.field_0x3;
            UVar19 = pMVar35[-1].next.value;
            pMVar35->moves[0].from = pMVar35[-1].next.from;
            pMVar35->moves[0].to = UVar20;
            pMVar35->moves[0].capture = UVar21;
            pMVar35->moves[0].field_0x3 = uVar23;
            pMVar35->moves[0].value = UVar19;
            uVar4 = pMVar35[-1].move_nums;
            pMVar35 = (MoveGenerate *)&pMVar35[-1].next;
          }
          pMVar35->moves[0].from = UVar15;
          pMVar35->moves[0].to = UVar16;
          pMVar35->moves[0].capture = UVar17;
          pMVar35->moves[0].field_0x3 = uVar18;
          pMVar35->moves[0].value = uVar5;
          pMVar35->moves[0].catc = uVar7;
          pMVar35->moves[0].movec = uVar9;
          *(undefined2 *)&pMVar35->moves[0].field_0xa = uVar11;
          pMVar29 = (MoveGenerate *)(pMVar29->moves + 1);
        } while (pMVar29 != __last);
      }
    }
    generate->index = 0;
    generate->state = 3;
    iVar28 = 0;
    break;
  case 3:
    iVar28 = generate->index;
    break;
  case 4:
    goto switchD_00106645_caseD_4;
  case 5:
    goto LAB_00106906;
  case 6:
    goto switchD_00106645_caseD_6;
  case 7:
    goto switchD_00106645_caseD_7;
  default:
    return false;
  }
  if ((iVar28 < generate->move_nums) && (1 < generate->moves[iVar28].value)) {
    pMVar32 = generate->moves + iVar28;
    UVar15 = pMVar32->movec;
    uVar22 = *(undefined2 *)&pMVar32->field_0xa;
    (generate->next).catc = pMVar32->catc;
    (generate->next).movec = UVar15;
    *(undefined2 *)&(generate->next).field_0xa = uVar22;
    UVar15 = pMVar32->to;
    UVar16 = pMVar32->capture;
    uVar18 = pMVar32->field_0x3;
    UVar19 = pMVar32->value;
    (generate->next).from = pMVar32->from;
    (generate->next).to = UVar15;
    (generate->next).capture = UVar16;
    (generate->next).field_0x3 = uVar18;
    (generate->next).value = UVar19;
  }
  else {
switchD_00106645_caseD_4:
    generate->state = 5;
    if (KillerTable[step][0].from != '\0') {
      pMVar32 = KillerTable[step];
      bVar27 = MovementsLegal(*pMVar32,situation);
      if (bVar27) {
        paMVar13 = KillerTable + step;
        UVar15 = ((Movement *)((long)paMVar13 + 0))->movec;
        uVar22 = *(undefined2 *)&((Movement *)((long)paMVar13 + 0))->field_0xa;
        (generate->next).catc = ((Movement *)((long)paMVar13 + 0))->catc;
        (generate->next).movec = UVar15;
        *(undefined2 *)&(generate->next).field_0xa = uVar22;
        uVar31._0_1_ = pMVar32->from;
        uVar31._1_1_ = pMVar32->to;
        uVar31._2_1_ = pMVar32->capture;
        uVar31._3_1_ = pMVar32->field_0x3;
        uVar31._4_4_ = pMVar32->value;
        goto LAB_0010694a;
      }
    }
LAB_00106906:
    generate->state = 6;
    if (KillerTable[step][1].from != '\0') {
      hash_move = KillerTable[step] + 1;
      bVar27 = MovementsLegal(*hash_move,situation);
      if (bVar27) {
LAB_0010693d:
        UVar15 = hash_move->movec;
        uVar22 = *(undefined2 *)&hash_move->field_0xa;
        (generate->next).catc = hash_move->catc;
        (generate->next).movec = UVar15;
        *(undefined2 *)&(generate->next).field_0xa = uVar22;
        uVar31._0_1_ = hash_move->from;
        uVar31._1_1_ = hash_move->to;
        uVar31._2_1_ = hash_move->capture;
        uVar31._3_1_ = hash_move->field_0x3;
        uVar31._4_4_ = hash_move->value;
LAB_0010694a:
        (generate->next).from = (char)uVar31;
        (generate->next).to = (char)((ulong)uVar31 >> 8);
        (generate->next).capture = (char)((ulong)uVar31 >> 0x10);
        (generate->next).field_0x3 = (char)((ulong)uVar31 >> 0x18);
        (generate->next).value = (int)((ulong)uVar31 >> 0x20);
        return true;
      }
    }
switchD_00106645_caseD_6:
    iVar28 = generate->move_nums;
    lVar37 = (long)iVar28;
    GetAllNotCaptureMovements(situation,&generate->move_nums,generate->moves);
    iVar3 = generate->move_nums;
    if (iVar28 < iVar3) {
      pMVar32 = generate->moves + lVar37;
      lVar34 = lVar37;
      do {
        pMVar32->value = HistoryTable[pMVar32->from][pMVar32->to];
        lVar34 = lVar34 + 1;
        pMVar32 = pMVar32 + 1;
      } while (lVar34 < generate->move_nums);
    }
    if (iVar28 != iVar3) {
      pMVar32 = generate->moves + lVar37;
      __last_00 = generate->moves + iVar3;
      lVar39 = (long)iVar3 * 0xc + lVar37 * -0xc;
      uVar33 = (lVar39 >> 2) * -0x5555555555555555;
      lVar34 = 0x3f;
      if (uVar33 != 0) {
        for (; uVar33 >> lVar34 == 0; lVar34 = lVar34 + -1) {
        }
      }
      std::
      __introsort_loop<Movement*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Movement&,Movement&)>>
                (pMVar32,__last_00,(ulong)(((uint)lVar34 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(Movement_&,_Movement_&)>)0x105fe2);
      pMVar40 = pMVar32;
      if (lVar39 < 0xc1) {
        while (pMVar36 = pMVar40 + 1, pMVar36 != __last_00) {
          uVar4 = pMVar36->value;
          if (pMVar32->value < uVar4) {
            UVar20 = pMVar36->catc;
            UVar21 = pMVar36->movec;
            uVar22 = *(undefined2 *)&pMVar36->field_0xa;
            UVar15 = pMVar36->from;
            UVar16 = pMVar36->to;
            UVar17 = pMVar36->capture;
            uVar18 = pMVar36->field_0x3;
            UVar19 = pMVar36->value;
            memmove((void *)((long)pMVar40 + (0x18 - ((long)pMVar36 - (long)pMVar32))),pMVar32,
                    (long)pMVar36 - (long)pMVar32);
            pMVar32->from = UVar15;
            pMVar32->to = UVar16;
            pMVar32->capture = UVar17;
            pMVar32->field_0x3 = uVar18;
            pMVar32->value = UVar19;
            pMVar32->catc = UVar20;
            pMVar32->movec = UVar21;
            *(undefined2 *)&pMVar32->field_0xa = uVar22;
            pMVar40 = pMVar36;
          }
          else {
            UVar15 = pMVar36->from;
            UVar16 = pMVar36->to;
            UVar17 = pMVar36->capture;
            uVar18 = pMVar36->field_0x3;
            UVar20 = pMVar36->catc;
            UVar21 = pMVar36->movec;
            uVar22 = *(undefined2 *)&pMVar36->field_0xa;
            uVar2 = pMVar40->value;
            pMVar40 = pMVar36;
            while (uVar2 < uVar4) {
              UVar24 = pMVar40[-1].movec;
              uVar25 = *(undefined2 *)&pMVar40[-1].field_0xa;
              pMVar40->catc = pMVar40[-1].catc;
              pMVar40->movec = UVar24;
              *(undefined2 *)&pMVar40->field_0xa = uVar25;
              UVar24 = pMVar40[-1].to;
              UVar26 = pMVar40[-1].capture;
              uVar23 = pMVar40[-1].field_0x3;
              UVar19 = pMVar40[-1].value;
              pMVar40->from = pMVar40[-1].from;
              pMVar40->to = UVar24;
              pMVar40->capture = UVar26;
              pMVar40->field_0x3 = uVar23;
              pMVar40->value = UVar19;
              uVar2 = pMVar40[-2].value;
              pMVar40 = pMVar40 + -1;
            }
            pMVar40->from = UVar15;
            pMVar40->to = UVar16;
            pMVar40->capture = UVar17;
            pMVar40->field_0x3 = uVar18;
            pMVar40->value = uVar4;
            pMVar40->catc = UVar20;
            pMVar40->movec = UVar21;
            *(undefined2 *)&pMVar40->field_0xa = uVar22;
            pMVar40 = pMVar36;
          }
        }
      }
      else {
        pMVar40 = generate->moves + lVar37;
        sVar38 = 0xc;
        pMVar36 = pMVar32;
        do {
          pMVar40 = pMVar40 + 1;
          pMVar1 = (Movement *)(&pMVar32->from + sVar38);
          uVar4 = *(uint *)((long)&pMVar32->value + sVar38);
          if (pMVar32->value < uVar4) {
            UVar20 = pMVar1->catc;
            UVar21 = pMVar1->movec;
            uVar22 = *(undefined2 *)&pMVar1->field_0xa;
            UVar15 = pMVar1->from;
            UVar16 = pMVar1->to;
            UVar17 = pMVar1->capture;
            uVar18 = pMVar1->field_0x3;
            UVar19 = pMVar1->value;
            memmove((void *)((long)pMVar36 + (0x18 - sVar38)),pMVar32,sVar38);
            pMVar32->from = UVar15;
            pMVar32->to = UVar16;
            pMVar32->capture = UVar17;
            pMVar32->field_0x3 = uVar18;
            pMVar32->value = UVar19;
            pMVar32->catc = UVar20;
            pMVar32->movec = UVar21;
            *(undefined2 *)&pMVar32->field_0xa = uVar22;
          }
          else {
            UVar15 = pMVar1->from;
            UVar16 = pMVar1->to;
            UVar17 = pMVar1->capture;
            uVar18 = pMVar1->field_0x3;
            UVar20 = pMVar1->catc;
            UVar21 = pMVar1->movec;
            uVar22 = *(undefined2 *)&pMVar1->field_0xa;
            uVar2 = pMVar36->value;
            pMVar36 = pMVar1;
            pMVar14 = pMVar40;
            while (uVar2 < uVar4) {
              pMVar36 = pMVar14 + -1;
              UVar24 = pMVar14[-1].movec;
              uVar25 = *(undefined2 *)&pMVar14[-1].field_0xa;
              pMVar14->catc = pMVar14[-1].catc;
              pMVar14->movec = UVar24;
              *(undefined2 *)&pMVar14->field_0xa = uVar25;
              UVar24 = pMVar14[-1].to;
              UVar26 = pMVar14[-1].capture;
              uVar23 = pMVar14[-1].field_0x3;
              UVar19 = pMVar14[-1].value;
              pMVar14->from = pMVar14[-1].from;
              pMVar14->to = UVar24;
              pMVar14->capture = UVar26;
              pMVar14->field_0x3 = uVar23;
              pMVar14->value = UVar19;
              uVar2 = pMVar14[-2].value;
              pMVar14 = pMVar36;
            }
            pMVar36->from = UVar15;
            pMVar36->to = UVar16;
            pMVar36->capture = UVar17;
            pMVar36->field_0x3 = uVar18;
            pMVar36->value = uVar4;
            pMVar36->catc = UVar20;
            pMVar36->movec = UVar21;
            *(undefined2 *)&pMVar36->field_0xa = uVar22;
          }
          sVar38 = sVar38 + 0xc;
          pMVar36 = pMVar1;
        } while (sVar38 != 0xc0);
        for (pMVar32 = pMVar32 + 0x10; pMVar32 != __last_00; pMVar32 = pMVar32 + 1) {
          UVar15 = pMVar32->from;
          UVar16 = pMVar32->to;
          UVar17 = pMVar32->capture;
          uVar18 = pMVar32->field_0x3;
          uVar6 = pMVar32->value;
          uVar8 = pMVar32->catc;
          uVar10 = pMVar32->movec;
          uVar12 = *(undefined2 *)&pMVar32->field_0xa;
          uVar4 = pMVar32[-1].value;
          pMVar40 = pMVar32;
          while (uVar4 < (uint)uVar6) {
            UVar20 = pMVar40[-1].movec;
            uVar22 = *(undefined2 *)&pMVar40[-1].field_0xa;
            pMVar40->catc = pMVar40[-1].catc;
            pMVar40->movec = UVar20;
            *(undefined2 *)&pMVar40->field_0xa = uVar22;
            UVar20 = pMVar40[-1].to;
            UVar21 = pMVar40[-1].capture;
            uVar23 = pMVar40[-1].field_0x3;
            UVar19 = pMVar40[-1].value;
            pMVar40->from = pMVar40[-1].from;
            pMVar40->to = UVar20;
            pMVar40->capture = UVar21;
            pMVar40->field_0x3 = uVar23;
            pMVar40->value = UVar19;
            uVar4 = pMVar40[-2].value;
            pMVar40 = pMVar40 + -1;
          }
          pMVar40->from = UVar15;
          pMVar40->to = UVar16;
          pMVar40->capture = UVar17;
          pMVar40->field_0x3 = uVar18;
          pMVar40->value = uVar6;
          pMVar40->catc = uVar8;
          pMVar40->movec = uVar10;
          *(undefined2 *)&pMVar40->field_0xa = uVar12;
        }
      }
    }
    generate->state = 7;
switchD_00106645_caseD_7:
    iVar28 = generate->index;
    if (generate->move_nums <= iVar28) {
      return false;
    }
    pMVar32 = generate->moves + iVar28;
    UVar15 = pMVar32->movec;
    uVar22 = *(undefined2 *)&pMVar32->field_0xa;
    (generate->next).catc = pMVar32->catc;
    (generate->next).movec = UVar15;
    *(undefined2 *)&(generate->next).field_0xa = uVar22;
    pMVar32 = generate->moves + iVar28;
    UVar15 = pMVar32->to;
    UVar16 = pMVar32->capture;
    uVar18 = pMVar32->field_0x3;
    UVar19 = pMVar32->value;
    (generate->next).from = pMVar32->from;
    (generate->next).to = UVar15;
    (generate->next).capture = UVar16;
    (generate->next).field_0x3 = uVar18;
    (generate->next).value = UVar19;
  }
  generate->index = iVar28 + 1;
  return true;
}

Assistant:

bool NextMove(const Situation& situation, MoveGenerate& generate, Movement& hash_move, int step){
    int flag;
    switch (generate.state)
    {
    case HASH_GET:
        generate.state = CAP_GEN;
        if(hash_move.from && MovementsLegal(hash_move, situation)){
            generate.next = hash_move;
            return true;
        }
    case CAP_GEN:   // 生成吃子着法
        GetAllCaptureMovements(situation, generate.move_nums, generate.moves);
        CaptureValue(situation, generate.move_nums, generate.moves);
        std::sort(generate.moves, generate.moves + generate.move_nums, cmp);

        generate.index = 0;
        generate.state = CAP_GET;
    case CAP_GET:
        if(generate.index < generate.move_nums && generate.moves[generate.index].value > 1){
            generate.next = generate.moves[generate.index];
            generate.index++;
            return true;
        }
    case KILL1_GET:
        generate.state = KILL2_GET;
        if(KillerTable[step][0].from && MovementsLegal(KillerTable[step][0], situation)){
            generate.next = KillerTable[step][0];
            return true;
        }
    case KILL2_GET:
        generate.state = NOCAP_GEN;
        if(KillerTable[step][1].from && MovementsLegal(KillerTable[step][1], situation)){
            generate.next = KillerTable[step][1];
            return true;
        }
    case NOCAP_GEN:
        flag = generate.move_nums;
        GetAllNotCaptureMovements(situation, generate.move_nums, generate.moves);
        NoCaptureValue(situation, generate.move_nums, generate.moves, flag);
        std::sort(generate.moves + flag, generate.moves + generate.move_nums, cmp);
    
        generate.state = NOCAP_GET;
    case NOCAP_GET:
        if(generate.index < generate.move_nums){
            generate.next = generate.moves[generate.index];
            generate.index++;
            return true;
        }
    default:
        return false;
    }
}